

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O2

RectMatrix<double,_3U,_3U> *
OpenMD::operator*(RectMatrix<double,_3U,_3U> *__return_storage_ptr__,RectMatrix<double,_3U,_3U> *m1,
                 RectMatrix<double,_3U,_3U> *m2)

{
  double *pdVar1;
  uint i;
  long lVar2;
  double (*padVar3) [3];
  long lVar4;
  double (*padVar5) [3];
  uint k;
  long lVar6;
  double dVar7;
  
  RectMatrix<double,_3U,_3U>::RectMatrix(__return_storage_ptr__);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    padVar3 = (double (*) [3])m2;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      pdVar1 = __return_storage_ptr__->data_[lVar2] + lVar4;
      dVar7 = *pdVar1;
      padVar5 = padVar3;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        dVar7 = dVar7 + (*(double (*) [3])*(double (*) [3])m1)[lVar6] *
                        (*(double (*) [3])*padVar5)[0];
        padVar5 = padVar5 + 1;
      }
      *pdVar1 = dVar7;
      padVar3 = (double (*) [3])(*padVar3 + 1);
    }
    m1 = (RectMatrix<double,_3U,_3U> *)((long)m1 + 0x18);
  }
  return __return_storage_ptr__;
}

Assistant:

inline RectMatrix<Real, Row, Col> operator*(
      const RectMatrix<Real, Row, SameDim>& m1,
      const RectMatrix<Real, SameDim, Col>& m2) {
    RectMatrix<Real, Row, Col> result;

    for (unsigned int i = 0; i < Row; i++)
      for (unsigned int j = 0; j < Col; j++)
        for (unsigned int k = 0; k < SameDim; k++)
          result(i, j) += m1(i, k) * m2(k, j);

    return result;
  }